

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O3

Twist * __thiscall
iDynTree::Axis::getRotationTwist(Twist *__return_storage_ptr__,Axis *this,double dtheta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  PointerType ptr;
  
  Twist::Twist(__return_storage_ptr__);
  dVar1 = (this->direction).super_Vector3.m_data[0];
  dVar2 = (this->origin).super_Vector3.m_data[0];
  dVar3 = (this->origin).super_Vector3.m_data[1];
  dVar4 = (this->origin).super_Vector3.m_data[2];
  dVar5 = (this->direction).super_Vector3.m_data[1];
  dVar6 = (this->direction).super_Vector3.m_data[2];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       (dVar6 * dVar3 - dVar4 * dVar5) * dtheta;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] =
       (dVar1 * dVar4 - dVar2 * dVar6) * dtheta;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       (dVar2 * dVar5 - dVar1 * dVar3) * dtheta;
  dVar1 = (this->direction).super_Vector3.m_data[1];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] =
       (this->direction).super_Vector3.m_data[0] * dtheta;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] =
       dVar1 * dtheta;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] =
       dVar6 * dtheta;
  return __return_storage_ptr__;
}

Assistant:

Twist Axis::getRotationTwist(const double dtheta) const
    {
        Twist ret;

        Eigen::Map<Eigen::Vector3d> linVel(ret.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> angVel(ret.getAngularVec3().data());

        Eigen::Map<const Eigen::Vector3d> dir(direction.data());
        Eigen::Map<const Eigen::Vector3d> orig(origin.data());

        linVel = dtheta*(orig.cross(dir));
        angVel = dir*dtheta;

        return ret;
    }